

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.cpp
# Opt level: O2

string * __thiscall Item::getName_abi_cxx11_(string *__return_storage_ptr__,Item *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

Item::Item(std::string d, itemType t) : name(d), item(t) {}